

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1d508dd::XdgDesktopPortalColorPicker::pickColor
          (XdgDesktopPortalColorPicker *this)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QDBusMessage *this_00;
  QDBusPendingCallWatcher *this_01;
  ContextType *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar1;
  QDBusPendingCallWatcher *watcher;
  QDBusPendingCall pendingCall;
  QDBusMessage message;
  size_t in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  QString *str;
  QString *in_stack_fffffffffffffe60;
  QString *this_02;
  qsizetype in_stack_fffffffffffffe80;
  QMap_conflict *pQVar2;
  char *in_stack_fffffffffffffe88;
  QVariant *this_03;
  Object *sender;
  ConnectionType type;
  Object local_d0 [8];
  QDBusConnection local_c8 [8];
  undefined1 *local_c0;
  undefined8 local_b8 [4];
  undefined1 local_98 [24];
  QString local_80;
  undefined1 local_68 [24];
  undefined1 *local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  Qt::Literals::StringLiterals::operator____L1(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  QVar1.m_data = in_stack_fffffffffffffe88;
  QVar1.m_size = in_stack_fffffffffffffe80;
  QString::QString(in_stack_fffffffffffffe60,QVar1);
  Qt::Literals::StringLiterals::operator____L1(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  this_02 = &local_80;
  latin1.m_data = in_stack_fffffffffffffe88;
  latin1.m_size = in_stack_fffffffffffffe80;
  QString::QString(this_02,latin1);
  QVar1 = Qt::Literals::StringLiterals::operator____L1
                    (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  type = (ConnectionType)QVar1.m_size;
  str = (QString *)local_98;
  latin1_00.m_data = in_stack_fffffffffffffe88;
  latin1_00.m_size = in_stack_fffffffffffffe80;
  QString::QString(this_02,latin1_00);
  Qt::Literals::StringLiterals::operator____L1((char *)str,in_stack_fffffffffffffe50);
  latin1_01.m_data = in_stack_fffffffffffffe88;
  latin1_01.m_size = in_stack_fffffffffffffe80;
  QString::QString(this_02,latin1_01);
  QDBusMessage::createMethodCall((QString *)&local_50,(QString *)local_68,(QString *)this_02,str);
  QString::~QString((QString *)0xac9e74);
  QString::~QString((QString *)0xac9e7e);
  QString::~QString((QString *)0xac9e88);
  QString::~QString((QString *)0xac9e92);
  this_03 = &local_28;
  ::QVariant::QVariant(this_03,(QString *)(in_RDI + 0x10));
  this_00 = (QDBusMessage *)QDBusMessage::operator<<((QDBusMessage *)&local_50,this_03);
  local_b8[0] = 0;
  pQVar2 = (QMap_conflict *)local_b8;
  QMap<QString,_QVariant>::QMap((QMap<QString,_QVariant> *)0xac9edf);
  ::QVariant::QVariant(&local_48,pQVar2);
  QDBusMessage::operator<<(this_00,&local_48);
  ::QVariant::~QVariant(&local_48);
  QMap<QString,_QVariant>::~QMap((QMap<QString,_QVariant> *)0xac9f19);
  ::QVariant::~QVariant(this_03);
  local_c0 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  QDBusConnection::asyncCall((QDBusMessage *)&local_c0,(int)local_c8);
  QDBusConnection::~QDBusConnection(local_c8);
  this_01 = (QDBusPendingCallWatcher *)operator_new(0x18);
  QDBusPendingCallWatcher::QDBusPendingCallWatcher
            (this_01,(QDBusPendingCall *)&local_c0,(QObject *)in_RDI);
  sender = local_d0;
  QObject::
  connect<void(QDBusPendingCallWatcher::*)(QDBusPendingCallWatcher*),(anonymous_namespace)::XdgDesktopPortalColorPicker::pickColor()::_lambda(QDBusPendingCallWatcher*)_1_>
            (sender,0,in_RDI,(anon_class_8_1_8991fb9c_for_o *)this_01,type);
  QMetaObject::Connection::~Connection((Connection *)sender);
  QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_c0);
  QDBusMessage::~QDBusMessage((QDBusMessage *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pickColor() override
    {
        // DBus signature:
        // PickColor (IN   s      parent_window,
        //            IN   a{sv}  options
        //            OUT  o      handle)
        // Options:
        // handle_token (s) -  A string that will be used as the last element of the @handle.

        QDBusMessage message = QDBusMessage::createMethodCall(
                "org.freedesktop.portal.Desktop"_L1, "/org/freedesktop/portal/desktop"_L1,
                "org.freedesktop.portal.Screenshot"_L1, "PickColor"_L1);
        message << m_parentWindowId << QVariantMap();

        QDBusPendingCall pendingCall = QDBusConnection::sessionBus().asyncCall(message);
        auto watcher = new QDBusPendingCallWatcher(pendingCall, this);
        connect(watcher, &QDBusPendingCallWatcher::finished, this,
                [this](QDBusPendingCallWatcher *watcher) {
                    watcher->deleteLater();
                    QDBusPendingReply<QDBusObjectPath> reply = *watcher;
                    if (reply.isError()) {
                        qWarning("DBus call to pick color failed: %s",
                                 qPrintable(reply.error().message()));
                        Q_EMIT colorPicked({});
                    } else {
                        QDBusConnection::sessionBus().connect(
                                "org.freedesktop.portal.Desktop"_L1, reply.value().path(),
                                "org.freedesktop.portal.Request"_L1, "Response"_L1, this,
                                // clang-format off
                                SLOT(gotColorResponse(uint,QVariantMap))
                                // clang-format on
                        );
                    }
                });
    }